

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_data.hpp
# Opt level: O2

void duckdb::ArrowListData<long>::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *pAVar1;
  LogicalType *type_00;
  reference pvVar2;
  ArrowArray *pAVar3;
  reference pvVar4;
  long lVar5;
  byte bVar6;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_20;
  
  bVar6 = 0;
  result->n_buffers = 2;
  pAVar1 = ArrowAppendData::GetMainBuffer(append_data);
  result->buffers[1] = pAVar1->dataptr;
  type_00 = ListType::GetChildType(type);
  ArrowAppender::AddChildren(append_data,1);
  result->children =
       (append_data->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  result->n_children = 1;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::get<true>(&append_data->child_data,0);
  local_20._M_head_impl =
       (pvVar2->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (pvVar2->super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar3 = ArrowAppender::FinalizeChild
                     (type_00,(unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                               *)&local_20);
  pvVar4 = vector<ArrowArray,_true>::get<true>(&append_data->child_arrays,0);
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pvVar4->length = pAVar3->length;
    pAVar3 = (ArrowArray *)((long)pAVar3 + (ulong)bVar6 * -0x10 + 8);
    pvVar4 = (reference)((long)pvVar4 + (ulong)bVar6 * -0x10 + 8);
  }
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              &local_20);
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		result->n_buffers = 2;
		result->buffers[1] = append_data.GetMainBuffer().data();

		auto &child_type = ListType::GetChildType(type);
		ArrowAppender::AddChildren(append_data, 1);
		result->children = append_data.child_pointers.data();
		result->n_children = 1;
		append_data.child_arrays[0] = *ArrowAppender::FinalizeChild(child_type, std::move(append_data.child_data[0]));
	}